

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lopcodes.c
# Opt level: O0

void ravi_dump_function(lua_State *L)

{
  size_t len;
  undefined1 local_30 [8];
  membuff_t mb;
  Proto *f;
  lua_State *L_local;
  
  membuff_init((membuff_t *)local_30,0x1000);
  if (L->top[-1].tt_ != 0x8006) {
    __assert_fail("((((L->top+(-1)))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lopcodes.c"
                  ,0x27a,"void ravi_dump_function(lua_State *)");
  }
  if ((L->top[-1].value_.gc)->tt == '\x06') {
    mb.pos = *(size_t *)(L->top[-1].value_.f + 0x18);
    ravi_print_function((membuff_t *)local_30,(Proto *)mb.pos,1);
    len = strlen((char *)local_30);
    ravi_writestring(L,(char *)local_30,len);
    membuff_free((membuff_t *)local_30);
    return;
  }
  __assert_fail("(((L->top+(-1))->value_).gc)->tt == ((6) | ((0) << 4))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lopcodes.c"
                ,0x27a,"void ravi_dump_function(lua_State *)");
}

Assistant:

void ravi_dump_function(lua_State *L)
{
  Proto* f;
  membuff_t mb;

  membuff_init(&mb, 4096);
  f = toproto(L, -1);
  ravi_print_function(&mb, f, 1);
  ravi_writestring(L, mb.buf, strlen(mb.buf));
  membuff_free(&mb);
}